

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O1

void __thiscall polyscope::SlicePlane::setPose(SlicePlane *this,vec3 planePosition,vec3 planeNormal)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar7;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar8;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar9;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar10;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar11;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar12;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar13;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar14;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar15;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar16;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar17;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar18;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar19;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar20;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar21;
  int i_1;
  mapped_type *pmVar22;
  int i;
  int iVar23;
  float *pfVar24;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *paVar25;
  float fVar26;
  undefined8 in_XMM0_Qb;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 auVar33 [16];
  float fVar34;
  undefined1 auVar35 [64];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_ac;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_a8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_a4;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_a0;
  float local_9c [8];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_7c;
  float local_78 [4];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  aVar36 = planeNormal.field_2;
  auVar35._8_56_ = planeNormal._8_56_;
  auVar35._0_8_ = planeNormal._0_8_;
  local_7c = planePosition.field_2;
  local_18 = planePosition._0_8_;
  fVar34 = (this->objectTransform).value.value[1].field_2.z;
  local_38._0_4_ = (this->objectTransform).value.value[2].field_2;
  auVar27._0_4_ = planeNormal.field_0.x * planeNormal.field_0.x;
  auVar27._4_4_ = planeNormal.field_1.y * planeNormal.field_1.y;
  auVar27._8_4_ = planeNormal.field_2 * planeNormal.field_2;
  auVar27._12_4_ = planeNormal._12_4_ * planeNormal._12_4_;
  auVar37 = vhaddps_avx(auVar27,auVar27);
  fVar26 = aVar36.z * aVar36.z + auVar37._0_4_;
  local_28._0_4_ = (this->objectTransform).value.value[2].field_0;
  local_28._4_4_ = (this->objectTransform).value.value[2].field_1;
  uStack_20 = 0;
  uVar1 = (this->objectTransform).value.value[1].field_0;
  uVar2 = (this->objectTransform).value.value[1].field_1;
  auVar37._4_4_ = uVar2;
  auVar37._0_4_ = uVar1;
  auVar37._8_8_ = 0;
  uStack_10 = in_XMM0_Qb;
  if (fVar26 < 0.0) {
    local_48._0_4_ = aVar36;
    local_68 = auVar37;
    local_58 = auVar35._0_16_;
    fVar26 = sqrtf(fVar26);
    auVar27 = local_58;
    auVar37 = local_68;
  }
  else {
    auVar27 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
    fVar26 = auVar27._0_4_;
    local_48._0_4_ = aVar36;
    auVar27 = auVar35._0_16_;
  }
  fVar26 = 1.0 / fVar26;
  auVar38._0_4_ = fVar26 * auVar27._0_4_;
  auVar38._4_4_ = fVar26 * auVar27._4_4_;
  auVar38._8_4_ = fVar26 * auVar27._8_4_;
  auVar38._12_4_ = fVar26 * auVar27._12_4_;
  fVar26 = fVar26 * (float)local_48._0_4_;
  auVar28._0_4_ = auVar38._0_4_ * auVar37._0_4_;
  auVar28._4_4_ = auVar38._4_4_ * auVar37._4_4_;
  auVar28._8_4_ = auVar38._8_4_ * auVar37._8_4_;
  auVar28._12_4_ = auVar38._12_4_ * auVar37._12_4_;
  auVar27 = vhaddps_avx(auVar28,auVar28);
  fVar32 = fVar26 * fVar34 + auVar27._0_4_;
  auVar33._0_4_ = auVar38._0_4_ * fVar32;
  auVar33._4_4_ = auVar38._4_4_ * fVar32;
  auVar33._8_4_ = auVar38._8_4_ * fVar32;
  auVar33._12_4_ = auVar38._12_4_ * fVar32;
  auVar27 = vsubps_avx(auVar37,auVar33);
  fVar34 = fVar34 - fVar26 * fVar32;
  auVar29._0_4_ = auVar27._0_4_ * auVar27._0_4_;
  auVar29._4_4_ = auVar27._4_4_ * auVar27._4_4_;
  auVar29._8_4_ = auVar27._8_4_ * auVar27._8_4_;
  auVar29._12_4_ = auVar27._12_4_ * auVar27._12_4_;
  auVar37 = vhaddps_avx(auVar29,auVar29);
  fVar32 = fVar34 * fVar34 + auVar37._0_4_;
  local_48 = auVar38;
  if (fVar32 < 0.0) {
    local_58._0_4_ = fVar34;
    local_68 = auVar27;
    fVar32 = sqrtf(fVar32);
    fVar34 = (float)local_58._0_4_;
    auVar27 = local_68;
  }
  else {
    auVar37 = vsqrtss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32));
    fVar32 = auVar37._0_4_;
  }
  if (fVar32 < 0.01) {
    auVar5._8_8_ = uStack_20;
    auVar5._0_8_ = local_28;
    auVar30._0_4_ = local_48._0_4_ * (float)local_28;
    auVar30._4_4_ = local_48._4_4_ * (float)((ulong)local_28 >> 0x20);
    auVar30._8_4_ = local_48._8_4_ * (float)uStack_20;
    auVar30._12_4_ = local_48._12_4_ * (float)((ulong)uStack_20 >> 0x20);
    auVar37 = vhaddps_avx(auVar30,auVar30);
    fVar34 = fVar26 * (float)local_38._0_4_ + auVar37._0_4_;
    auVar31._0_4_ = local_48._0_4_ * fVar34;
    auVar31._4_4_ = local_48._4_4_ * fVar34;
    auVar31._8_4_ = local_48._8_4_ * fVar34;
    auVar31._12_4_ = local_48._12_4_ * fVar34;
    auVar27 = vsubps_avx(auVar5,auVar31);
    fVar34 = (float)local_38._0_4_ - fVar26 * fVar34;
  }
  auVar37 = vmovshdup_avx(auVar27);
  fVar32 = fVar34 * fVar34 + auVar27._0_4_ * auVar27._0_4_ + auVar37._0_4_ * auVar37._0_4_;
  if (fVar32 < 0.0) {
    local_58._0_4_ = fVar34;
    local_68 = auVar27;
    local_38 = auVar37;
    fVar32 = sqrtf(fVar32);
    fVar34 = (float)local_58._0_4_;
    auVar37 = local_38;
    auVar27 = local_68;
  }
  else {
    auVar28 = vsqrtss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32));
    fVar32 = auVar28._0_4_;
  }
  fVar32 = 1.0 / fVar32;
  fVar3 = auVar27._0_4_ * fVar32;
  fVar4 = auVar37._0_4_ * fVar32;
  fVar34 = fVar34 * fVar32;
  auVar37 = vmovshdup_avx(local_48);
  local_78[3] = 1.0;
  iVar23 = 0;
  local_78[2] = 0.0;
  local_78[1] = 0.0;
  local_78[0] = 0.0;
  local_9c[7] = 0.0;
  local_9c[6] = 1.0;
  local_9c[5] = 0.0;
  local_9c[4] = 0.0;
  local_9c[3] = 0.0;
  local_9c[2] = 0.0;
  local_9c[1] = 1.0;
  local_9c[0] = 0.0;
  local_a0.z = 0.0;
  local_a4.z = 0.0;
  local_a8.z = 0.0;
  local_ac.z = 1.0;
  do {
    fVar32 = fVar26;
    if ((iVar23 != 2) && (fVar32 = local_48._0_4_, iVar23 == 1)) {
      fVar32 = auVar37._0_4_;
    }
    pfVar24 = local_78;
    if (((iVar23 != 3) && (pfVar24 = local_78 + 1, iVar23 != 2)) &&
       (pfVar24 = local_78 + 3, iVar23 == 1)) {
      pfVar24 = local_78 + 2;
    }
    *pfVar24 = fVar32;
    iVar23 = iVar23 + 1;
  } while (iVar23 != 3);
  auVar27 = vfmadd213ss_fma(ZEXT416((uint)fVar26),ZEXT416((uint)fVar3),
                            ZEXT416((uint)(local_48._0_4_ * -fVar34)));
  iVar23 = 0;
  do {
    fVar32 = fVar34;
    if ((iVar23 != 2) && (fVar32 = fVar3, iVar23 == 1)) {
      fVar32 = fVar4;
    }
    pfVar24 = local_9c + 4;
    if (((iVar23 != 3) && (pfVar24 = local_9c + 5, iVar23 != 2)) &&
       (pfVar24 = local_9c + 7, iVar23 == 1)) {
      pfVar24 = local_9c + 6;
    }
    *pfVar24 = fVar32;
    iVar23 = iVar23 + 1;
  } while (iVar23 != 3);
  auVar28 = vfmadd213ss_fma(ZEXT416((uint)fVar34),auVar37,ZEXT416((uint)(fVar26 * -fVar4)));
  auVar37 = vfmadd213ss_fma(ZEXT416((uint)fVar4),local_48,ZEXT416((uint)(auVar37._0_4_ * -fVar3)));
  iVar23 = 0;
  auVar6._8_8_ = uStack_10;
  auVar6._0_8_ = local_18;
  do {
    if (iVar23 == 2) {
      fVar34 = auVar37._0_4_;
    }
    else {
      fVar34 = auVar28._0_4_;
      if (iVar23 == 1) {
        fVar34 = auVar27._0_4_;
      }
    }
    pfVar24 = local_9c;
    if (((iVar23 != 3) && (pfVar24 = local_9c + 1, iVar23 != 2)) &&
       (pfVar24 = local_9c + 3, iVar23 == 1)) {
      pfVar24 = local_9c + 2;
    }
    *pfVar24 = fVar34;
    iVar23 = iVar23 + 1;
  } while (iVar23 != 3);
  auVar37 = vmovshdup_avx(auVar6);
  iVar23 = 0;
  do {
    aVar36 = local_7c;
    if ((iVar23 != 2) && (aVar36 = SUB84(local_18,0), iVar23 == 1)) {
      aVar36 = auVar37._0_4_;
    }
    paVar25 = &local_ac;
    if (((iVar23 != 3) && (paVar25 = &local_a8, iVar23 != 2)) && (paVar25 = &local_a0, iVar23 == 1))
    {
      paVar25 = &local_a4;
    }
    *paVar25 = aVar36;
    iVar23 = iVar23 + 1;
  } while (iVar23 != 3);
  (this->objectTransform).value.value[0].field_0.x = local_78[3];
  (this->objectTransform).value.value[0].field_1.y = local_78[2];
  (this->objectTransform).value.value[0].field_2.z = local_78[1];
  (this->objectTransform).value.value[0].field_3.w = local_78[0];
  (this->objectTransform).value.value[1].field_0.x = local_9c[7];
  (this->objectTransform).value.value[1].field_1.y = local_9c[6];
  (this->objectTransform).value.value[1].field_2.z = local_9c[5];
  (this->objectTransform).value.value[1].field_3.w = local_9c[4];
  (this->objectTransform).value.value[2].field_0.x = local_9c[3];
  (this->objectTransform).value.value[2].field_1.y = local_9c[2];
  (this->objectTransform).value.value[2].field_2.z = local_9c[1];
  (this->objectTransform).value.value[2].field_3.w = local_9c[0];
  (this->objectTransform).value.value[3].field_0.x = (float)local_a0;
  (this->objectTransform).value.value[3].field_1.y = (float)local_a4;
  (this->objectTransform).value.value[3].field_2.z = (float)local_a8;
  (this->objectTransform).value.value[3].field_3.w = (float)local_ac;
  pmVar22 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&detail::persistentCache_glmmat4,&(this->objectTransform).name);
  aVar7 = (this->objectTransform).value.value[0].field_1;
  aVar8 = (this->objectTransform).value.value[0].field_2;
  aVar9 = (this->objectTransform).value.value[0].field_3;
  aVar10 = (this->objectTransform).value.value[1].field_0;
  aVar11 = (this->objectTransform).value.value[1].field_1;
  aVar12 = (this->objectTransform).value.value[1].field_2;
  aVar13 = (this->objectTransform).value.value[1].field_3;
  aVar14 = (this->objectTransform).value.value[2].field_0;
  aVar15 = (this->objectTransform).value.value[2].field_1;
  aVar16 = (this->objectTransform).value.value[2].field_2;
  aVar17 = (this->objectTransform).value.value[2].field_3;
  aVar18 = (this->objectTransform).value.value[3].field_0;
  aVar19 = (this->objectTransform).value.value[3].field_1;
  aVar20 = (this->objectTransform).value.value[3].field_2;
  aVar21 = (this->objectTransform).value.value[3].field_3;
  pmVar22->value[0].field_0 = (this->objectTransform).value.value[0].field_0;
  pmVar22->value[0].field_1 = aVar7;
  pmVar22->value[0].field_2 = aVar8;
  pmVar22->value[0].field_3 = aVar9;
  pmVar22->value[1].field_0 = aVar10;
  pmVar22->value[1].field_1 = aVar11;
  pmVar22->value[1].field_2 = aVar12;
  pmVar22->value[1].field_3 = aVar13;
  pmVar22->value[2].field_0 = aVar14;
  pmVar22->value[2].field_1 = aVar15;
  pmVar22->value[2].field_2 = aVar16;
  pmVar22->value[2].field_3 = aVar17;
  pmVar22->value[3].field_0 = aVar18;
  pmVar22->value[3].field_1 = aVar19;
  pmVar22->value[3].field_2 = aVar20;
  pmVar22->value[3].field_3 = aVar21;
  (this->objectTransform).holdsDefaultValue = false;
  requestRedraw();
  return;
}

Assistant:

void SlicePlane::setPose(glm::vec3 planePosition, glm::vec3 planeNormal) {

  // Choose the other axes to be most similar to the current ones, which will make animations look smoother
  // if the grid is shown
  glm::vec3 currBasisX{objectTransform.get()[1][0], objectTransform.get()[1][1], objectTransform.get()[1][2]};
  glm::vec3 currBasisY{objectTransform.get()[2][0], objectTransform.get()[2][1], objectTransform.get()[2][2]};

  glm::vec3 normal = glm::normalize(planeNormal);
  glm::vec3 basisX = currBasisX - normal * glm::dot(normal, currBasisX);
  if (glm::length(basisX) < 0.01) basisX = currBasisY - normal * glm::dot(normal, currBasisY);
  basisX = glm::normalize(basisX);
  glm::vec3 basisY = glm::cross(normal, basisX);

  // Build the rotation component
  glm::mat4x4 newTransform = glm::mat4x4(1.0);
  for (int i = 0; i < 3; i++) newTransform[0][i] = normal[i];
  for (int i = 0; i < 3; i++) newTransform[1][i] = basisX[i];
  for (int i = 0; i < 3; i++) newTransform[2][i] = basisY[i];

  // Build the translation component
  for (int i = 0; i < 3; i++) newTransform[3][i] = planePosition[i];

  objectTransform = newTransform;
  polyscope::requestRedraw();
}